

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O0

void __thiscall BayesianGameBase::~BayesianGameBase(BayesianGameBase *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  
  *in_RDI = &PTR__BayesianGameBase_00d06338;
  if ((void *)in_RDI[0x1a] != (void *)0x0) {
    operator_delete__((void *)in_RDI[0x1a]);
  }
  this_01 = (vector<double,_std::allocator<double>_> *)in_RDI[0x19];
  if (this_01 != (vector<double,_std::allocator<double>_> *)0x0) {
    operator_delete__(this_01);
  }
  pvVar1 = (void *)in_RDI[0xc];
  if (pvVar1 != (void *)0x0) {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)this_01);
    operator_delete(pvVar1,0x18);
  }
  this_00 = (mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
             *)in_RDI[0xd];
  if (this_00 !=
      (mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
       *)0x0) {
    std::
    map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::~map((map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            *)0x8a7c29);
    operator_delete(this_00,0x30);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  boost::numeric::ublas::
  mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  ::~mapped_vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_01);
  Interface_ProblemToPolicyDiscretePure::~Interface_ProblemToPolicyDiscretePure
            ((Interface_ProblemToPolicyDiscretePure *)0x8a7c80);
  return;
}

Assistant:

BayesianGameBase::~BayesianGameBase()
{
    delete [] _m_stepSizeTypes;
    delete [] _m_stepSizeActions;
    delete _m_jointToIndTypes;
    delete _m_jointToIndTypesMap;
}